

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall slang::driver::Driver::reportMacros(Driver *this)

{
  DefineDirectiveSyntax *pDVar1;
  pointer pSVar2;
  Preprocessor *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  pointer ppDVar3;
  string_view text;
  Token TVar4;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar5;
  string_view fmt;
  format_args args;
  string_view text_00;
  SyntaxPrinter printer;
  BumpAllocator alloc;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  SyntaxPrinter local_4c0;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_490;
  undefined1 local_478 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  undefined8 uStack_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined8 local_428;
  undefined8 uStack_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  undefined8 uStack_410;
  Diagnostics local_400;
  Preprocessor local_308;
  
  BumpAllocator::BumpAllocator((BumpAllocator *)&local_448.field_2);
  local_400.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.data_
       = (pointer)local_400.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_400.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len =
       0;
  local_400.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap =
       2;
  createOptionBag((Bag *)&local_4c0,this);
  local_428 = 0;
  uStack_420 = 0;
  parsing::Preprocessor::Preprocessor
            (&local_308,&this->sourceManager,(BumpAllocator *)&local_448.field_2,&local_400,
             (Bag *)&local_4c0,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  ska::detailv3::
  sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
  ::~sherwood_v3_table
            ((sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>
              *)&local_4c0);
  for (pSVar2 = (this->buffers).
                super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar2 != (this->buffers).
                super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 = pSVar2 + -1) {
    parsing::Preprocessor::pushSource(&local_308,pSVar2[-1]);
  }
  do {
    TVar4 = parsing::Preprocessor::next(&local_308);
  } while (TVar4.kind != EndOfFile);
  this_00 = &local_308;
  parsing::Preprocessor::getDefinedMacros(&local_490,this_00);
  if (local_490.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_490.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppDVar3 = local_490.
              super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pDVar1 = *ppDVar3;
      local_4c0.buffer._M_dataplus._M_p = (pointer)&local_4c0.buffer.field_2;
      local_4c0.buffer._M_string_length = 0;
      local_4c0.buffer.field_2._M_local_buf[0] = '\0';
      local_4c0.sourceManager = (SourceManager *)0x0;
      local_4c0.includePreprocessed = true;
      local_4c0.includeComments = false;
      local_4c0.squashNewlines = true;
      local_4c0.includeTrivia = false;
      local_4c0.includeMissing = false;
      local_4c0.includeSkipped = false;
      local_4c0.includeDirectives = false;
      TVar4.kind = (pDVar1->name).kind;
      TVar4._2_1_ = (pDVar1->name).field_0x2;
      TVar4.numFlags.raw = (pDVar1->name).numFlags.raw;
      TVar4.rawLen = (pDVar1->name).rawLen;
      TVar4.info = (pDVar1->name).info;
      slang::syntax::SyntaxPrinter::print(&local_4c0,TVar4);
      local_4c0.includeTrivia = true;
      if (pDVar1->formalArguments != (MacroFormalArgumentListSyntax *)0x0) {
        slang::syntax::SyntaxPrinter::print(&local_4c0,&pDVar1->formalArguments->super_SyntaxNode);
      }
      if ((pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>.size_ != 0) {
        sVar5 = parsing::Token::trivia
                          ((pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>.
                           data_);
        if (sVar5.size_ == 0) {
          text._M_str = " ";
          text._M_len = 1;
          slang::syntax::SyntaxPrinter::append(&local_4c0,text);
        }
      }
      slang::syntax::SyntaxPrinter::print
                (&local_4c0,&(pDVar1->body).super_SyntaxListBase.super_SyntaxNode);
      local_458 = &local_448;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458,local_4c0.buffer._M_dataplus._M_p,
                 local_4c0.buffer._M_dataplus._M_p + local_4c0.buffer._M_string_length);
      local_418 = local_458;
      uStack_410 = uStack_450;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x3;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_418;
      ::fmt::v9::vformat_abi_cxx11_((string *)local_478,(v9 *)0x3d014a,fmt,args);
      text_00._M_str = (char *)local_478._0_8_;
      text_00._M_len = local_478._8_8_;
      this_00 = (Preprocessor *)local_478._0_8_;
      OS::print(text_00);
      if ((Preprocessor *)local_478._0_8_ != (Preprocessor *)(local_478 + 0x10)) {
        this_00 = (Preprocessor *)(local_478._16_8_ + 1);
        operator_delete((void *)local_478._0_8_,(ulong)this_00);
      }
      if (local_458 != &local_448) {
        this_00 = (Preprocessor *)(local_448._M_dataplus._M_p + 1);
        operator_delete(local_458,(ulong)this_00);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0.buffer._M_dataplus._M_p != &local_4c0.buffer.field_2) {
        this_00 = (Preprocessor *)
                  (CONCAT71(local_4c0.buffer.field_2._M_allocated_capacity._1_7_,
                            local_4c0.buffer.field_2._M_local_buf[0]) + 1);
        operator_delete(local_4c0.buffer._M_dataplus._M_p,(ulong)this_00);
      }
      ppDVar3 = ppDVar3 + 1;
    } while (ppDVar3 !=
             local_490.
             super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_490.
      super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    this_00 = (Preprocessor *)
              ((long)local_490.
                     super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_490.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_490.
                    super__Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,(ulong)this_00);
  }
  parsing::Preprocessor::~Preprocessor(&local_308);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&local_400,(EVP_PKEY_CTX *)this_00);
  BumpAllocator::~BumpAllocator((BumpAllocator *)&local_448.field_2);
  return;
}

Assistant:

void Driver::reportMacros() {
    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, createOptionBag());

    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    for (auto macro : preprocessor.getDefinedMacros()) {
        SyntaxPrinter printer;
        printer.setIncludeComments(false);
        printer.setIncludeTrivia(false);
        printer.print(macro->name);

        printer.setIncludeTrivia(true);
        if (macro->formalArguments)
            printer.print(*macro->formalArguments);

        if (!macro->body.empty() && macro->body[0].trivia().empty())
            printer.append(" "sv);

        printer.print(macro->body);

        OS::print(fmt::format("{}\n", printer.str()));
    }
}